

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O3

int hmacReset(HMACContext *ctx,SHAversion whichSha,uchar *key,int key_len)

{
  byte bVar1;
  uint bytecount;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_t __n;
  uchar k_ipad [128];
  uchar tempkey [64];
  USHAContext local_168;
  uint8_t local_78 [72];
  
  if (ctx == (HMACContext *)0x0) {
    return 1;
  }
  bytecount = USHABlockSize(whichSha);
  ctx->blockSize = bytecount;
  uVar2 = USHAHashSize(whichSha);
  ctx->hashSize = uVar2;
  ctx->whichSha = whichSha;
  if ((int)bytecount < key_len) {
    iVar3 = USHAReset(&local_168,whichSha);
    if ((iVar3 == 0) && (iVar3 = USHAInput(&local_168,key,key_len), iVar3 == 0)) {
      key = local_78;
      iVar3 = USHAResult(&local_168,key);
      key_len = uVar2;
      if (iVar3 == 0) goto LAB_00174cab;
    }
    uVar2 = 1;
  }
  else {
LAB_00174cab:
    if (key_len < 1) {
      key_len = 0;
    }
    else {
      uVar4 = 0;
      do {
        bVar1 = key[uVar4];
        *(byte *)((long)&local_168.whichSha + uVar4) = bVar1 ^ 0x36;
        ctx->k_opad[uVar4] = bVar1 ^ 0x5c;
        uVar4 = uVar4 + 1;
      } while ((uint)key_len != uVar4);
    }
    if (key_len < (int)bytecount) {
      __n = (ulong)(~key_len + bytecount) + 1;
      memset((void *)((long)&local_168.whichSha + (ulong)(uint)key_len),0x36,__n);
      memset(ctx->k_opad + (uint)key_len,0x5c,__n);
    }
    iVar3 = USHAReset(&ctx->shaContext,whichSha);
    uVar2 = 1;
    if (iVar3 == 0) {
      iVar3 = USHAInput(&ctx->shaContext,(uint8_t *)&local_168,bytecount);
      uVar2 = (uint)(iVar3 != 0);
    }
  }
  return uVar2;
}

Assistant:

int hmacReset(HMACContext *ctx, enum SHAversion whichSha,
    const unsigned char *key, int key_len)
{
    int i, blocksize, hashsize;

    /* inner padding - key XORd with ipad */
    unsigned char k_ipad[USHA_Max_Message_Block_Size];

    /* temporary buffer when keylen > blocksize */
    unsigned char tempkey[USHAMaxHashSize];

    if (!ctx) return shaNull;

    blocksize = ctx->blockSize = USHABlockSize(whichSha);
    hashsize = ctx->hashSize = USHAHashSize(whichSha);

    ctx->whichSha = whichSha;

    /*
    * If key is longer than the hash blocksize,
    * reset it to key = HASH(key).
    */
    if (key_len > blocksize) {
        USHAContext tctx;
        int err = USHAReset(&tctx, whichSha) ||
            USHAInput(&tctx, key, key_len) ||
            USHAResult(&tctx, tempkey);
        if (err != shaSuccess) return err;

        key = tempkey;
        key_len = hashsize;
    }

    /*
    * The HMAC transform looks like:
    *
    * SHA(K XOR opad, SHA(K XOR ipad, text))
    *
    * where K is an n byte key.
    * ipad is the byte 0x36 repeated blocksize times
    * opad is the byte 0x5c repeated blocksize times
    * and text is the data being protected.
    */

    /* store key into the pads, XOR'd with ipad and opad values */
    for (i = 0; i < key_len; i++) {
        k_ipad[i] = key[i] ^ 0x36;
        ctx->k_opad[i] = key[i] ^ 0x5c;
    }
    /* remaining pad bytes are '\0' XOR'd with ipad and opad values */
    for (; i < blocksize; i++) {
        k_ipad[i] = 0x36;
        ctx->k_opad[i] = 0x5c;
    }

    /* perform inner hash */
    /* init context for 1st pass */
    return USHAReset(&ctx->shaContext, whichSha) ||
        /* and start with inner pad */
        USHAInput(&ctx->shaContext, k_ipad, blocksize);
}